

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

TTDVar __thiscall
TTD::NSSnapValues::ParseTTDVar(NSSnapValues *this,bool readSeparator,FileReader *reader)

{
  byte bVar1;
  TTDVarEmitTag TVar2;
  int32 nValue;
  undefined7 in_register_00000031;
  FileReader *this_00;
  double value;
  TTD_PTR_ID addrVal;
  double doubleVal;
  int32 intVal;
  TTDVarEmitTag tag;
  TTDVar res;
  FileReader *reader_local;
  bool readSeparator_local;
  
  this_00 = (FileReader *)CONCAT71(in_register_00000031,readSeparator);
  bVar1 = (byte)this & 1;
  (*this_00->_vptr_FileReader[6])(this_00,(ulong)bVar1,reader,bVar1);
  TVar2 = FileReader::ReadTag<TTD::NSSnapValues::TTDVarEmitTag>(this_00,ttdVarTag,false);
  if (TVar2 == TTDVarNull) {
    FileReader::ReadNull(this_00,nullVal,true);
    _intVal = (Var)0x0;
  }
  else if (TVar2 == TTDVarInt) {
    nValue = FileReader::ReadInt32(this_00,i32Val,true);
    _intVal = Js::TaggedInt::ToVarUnchecked(nValue);
  }
  else if (TVar2 == TTDVarDouble) {
    value = FileReader::ReadDouble(this_00,doubleVal,true);
    _intVal = Js::JavascriptNumber::NewInlined(value,(ScriptContext *)0x0);
  }
  else {
    if (TVar2 != TTDVarAddr) {
      TTDAbort_unrecoverable_error("Is there something else?");
    }
    _intVal = (Var)FileReader::ReadAddr(this_00,ptrIdVal,true);
  }
  (*this_00->_vptr_FileReader[7])();
  return _intVal;
}

Assistant:

TTDVar ParseTTDVar(bool readSeparator, FileReader* reader)
        {
            reader->ReadRecordStart(readSeparator);

            TTDVar res = nullptr;
            TTDVarEmitTag tag = reader->ReadTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag);
            if(tag == TTDVarEmitTag::TTDVarNull)
            {
                reader->ReadNull(NSTokens::Key::nullVal, true);
                res = nullptr;
            }
            else if(tag == TTDVarEmitTag::TTDVarInt)
            {
                int32 intVal = reader->ReadInt32(NSTokens::Key::i32Val, true);
                res = Js::TaggedInt::ToVarUnchecked(intVal);
            }
#if FLOATVAR
            else if(tag == TTDVarEmitTag::TTDVarDouble)
            {
                double doubleVal = reader->ReadDouble(NSTokens::Key::doubleVal, true);
                res = Js::JavascriptNumber::NewInlined(doubleVal, nullptr);
            }
#endif
            else
            {
                TTDAssert(tag == TTDVarEmitTag::TTDVarAddr, "Is there something else?");

                TTD_PTR_ID addrVal = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
                res = TTD_COERCE_PTR_ID_TO_VAR(addrVal);
            }